

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsp_launcher.cpp
# Opt level: O1

void lscpp::write_lsp_message(transporter *t,string *content)

{
  _Head_base<0UL,_lscpp::transporter::iface_*,_false> _Var1;
  stringstream content_length;
  long *local_1c0 [2];
  long local_1b0 [2];
  stringstream local_1a0 [16];
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Content-Length: ",0x10);
  std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__cxx11::stringbuf::str();
  _Var1._M_head_impl =
       (t->impl_)._M_t.
       super___uniq_ptr_impl<lscpp::transporter::iface,_std::default_delete<lscpp::transporter::iface>_>
       ._M_t.
       super__Tuple_impl<0UL,_lscpp::transporter::iface_*,_std::default_delete<lscpp::transporter::iface>_>
       .super__Head_base<0UL,_lscpp::transporter::iface_*,_false>._M_head_impl;
  (*(_Var1._M_head_impl)->_vptr_iface[4])(_Var1._M_head_impl,local_1c0,1);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0],local_1b0[0] + 1);
  }
  local_1c0[0] = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"");
  _Var1._M_head_impl =
       (t->impl_)._M_t.
       super___uniq_ptr_impl<lscpp::transporter::iface,_std::default_delete<lscpp::transporter::iface>_>
       ._M_t.
       super__Tuple_impl<0UL,_lscpp::transporter::iface_*,_std::default_delete<lscpp::transporter::iface>_>
       .super__Head_base<0UL,_lscpp::transporter::iface_*,_false>._M_head_impl;
  (*(_Var1._M_head_impl)->_vptr_iface[4])(_Var1._M_head_impl,local_1c0,1);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0],local_1b0[0] + 1);
  }
  _Var1._M_head_impl =
       (t->impl_)._M_t.
       super___uniq_ptr_impl<lscpp::transporter::iface,_std::default_delete<lscpp::transporter::iface>_>
       ._M_t.
       super__Tuple_impl<0UL,_lscpp::transporter::iface_*,_std::default_delete<lscpp::transporter::iface>_>
       .super__Head_base<0UL,_lscpp::transporter::iface_*,_false>._M_head_impl;
  (*(_Var1._M_head_impl)->_vptr_iface[4])(_Var1._M_head_impl,content,0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return;
}

Assistant:

void write_lsp_message(transporter &t, std::string const &content) {
  std::stringstream content_length;
  content_length << "Content-Length: ";
  content_length << content.size();
  t.write_message(content_length.str(), true);
  t.write_message("", true);

  t.write_message(content);
}